

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

void __thiscall icu_63::TZGNCore::loadStrings(TZGNCore *this,UnicodeString *tzCanonicalID)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UnicodeString *mzID_00;
  int local_cc;
  int32_t i;
  StringEnumeration *mzIDs;
  UTimeZoneNameType genNonLocTypes [3];
  undefined1 local_a8 [8];
  UnicodeString mzGenName;
  UnicodeString goldenID;
  UnicodeString *mzID;
  UnicodeString *pUStack_18;
  UErrorCode status;
  UnicodeString *tzCanonicalID_local;
  TZGNCore *this_local;
  long *plVar3;
  
  pUStack_18 = tzCanonicalID;
  tzCanonicalID_local = (UnicodeString *)this;
  getGenericLocationName(this,tzCanonicalID);
  mzID._4_4_ = U_ZERO_ERROR;
  UnicodeString::UnicodeString((UnicodeString *)((long)&mzGenName.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_a8);
  genNonLocTypes[0] = UTZNM_UNKNOWN;
  iVar2 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[6])
                    (this->fTimeZoneNames,pUStack_18,(long)&mzID + 4);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  while ((mzID_00 = (UnicodeString *)(**(code **)(*plVar3 + 0x38))(plVar3,(long)&mzID + 4),
         mzID_00 != (UnicodeString *)0x0 && (UVar1 = ::U_FAILURE(mzID._4_4_), UVar1 == '\0'))) {
    (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
              (this->fTimeZoneNames,mzID_00,this->fTargetRegion,
               (undefined1 *)((long)&mzGenName.fUnion + 0x30));
    UVar1 = UnicodeString::operator!=(pUStack_18,(UnicodeString *)((long)&mzGenName.fUnion + 0x30));
    if (UVar1 != '\0') {
      local_cc = 0;
      while (genNonLocTypes[(long)local_cc + -2] != UTZNM_UNKNOWN) {
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                  (this->fTimeZoneNames,mzID_00,(ulong)genNonLocTypes[(long)local_cc + -2],local_a8)
        ;
        UVar1 = UnicodeString::isEmpty((UnicodeString *)local_a8);
        if (UVar1 == '\0') {
          getPartialLocationName
                    (this,pUStack_18,mzID_00,
                     genNonLocTypes[(long)local_cc + -2] == UTZNM_LONG_GENERIC,
                     (UnicodeString *)local_a8);
        }
        local_cc = local_cc + 1;
      }
    }
  }
  if ((plVar3 != (long *)0x0) && (plVar3 != (long *)0x0)) {
    (**(code **)(*plVar3 + 8))();
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_a8);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&mzGenName.fUnion + 0x30));
  return;
}

Assistant:

void
TZGNCore::loadStrings(const UnicodeString& tzCanonicalID) {
    // load the generic location name
    getGenericLocationName(tzCanonicalID);

    // partial location names
    UErrorCode status = U_ZERO_ERROR;

    const UnicodeString *mzID;
    UnicodeString goldenID;
    UnicodeString mzGenName;
    UTimeZoneNameType genNonLocTypes[] = {
        UTZNM_LONG_GENERIC, UTZNM_SHORT_GENERIC,
        UTZNM_UNKNOWN /*terminator*/
    };

    StringEnumeration *mzIDs = fTimeZoneNames->getAvailableMetaZoneIDs(tzCanonicalID, status);
    while ((mzID = mzIDs->snext(status)) != NULL) {
        if (U_FAILURE(status)) {
            break;
        }
        // if this time zone is not the golden zone of the meta zone,
        // partial location name (such as "PT (Los Angeles)") might be
        // available.
        fTimeZoneNames->getReferenceZoneID(*mzID, fTargetRegion, goldenID);
        if (tzCanonicalID != goldenID) {
            for (int32_t i = 0; genNonLocTypes[i] != UTZNM_UNKNOWN; i++) {
                fTimeZoneNames->getMetaZoneDisplayName(*mzID, genNonLocTypes[i], mzGenName);
                if (!mzGenName.isEmpty()) {
                    // getPartialLocationName formats a name and put it into the trie
                    getPartialLocationName(tzCanonicalID, *mzID,
                        (genNonLocTypes[i] == UTZNM_LONG_GENERIC), mzGenName);
                }
            }
        }
    }
    if (mzIDs != NULL) {
        delete mzIDs;
    }
}